

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_print_glsl_visitor.cpp
# Opt level: O0

void __thiscall ir_print_glsl_visitor::visit(ir_print_glsl_visitor *this,ir_if *ir)

{
  exec_node *peVar1;
  bool bVar2;
  exec_node **local_90;
  exec_node **local_88;
  exec_node **local_78;
  exec_node **local_70;
  ir_instruction *local_60;
  ir_instruction *local_58;
  ir_instruction *local_48;
  ir_instruction *local_40;
  exec_node **local_28;
  ir_instruction *inst_1;
  ir_instruction *inst;
  ir_if *ir_local;
  ir_print_glsl_visitor *this_local;
  
  string_buffer::asprintf_append(this->buffer,"if (");
  (*(ir->condition->super_ir_instruction)._vptr_ir_instruction[2])(ir->condition,this);
  string_buffer::asprintf_append(this->buffer,") {\n");
  this->indentation = this->indentation + 1;
  this->previous_skipped = false;
  bVar2 = ::exec_node_is_tail_sentinel((ir->then_instructions).head_sentinel.next);
  if (bVar2) {
    local_48 = (ir_instruction *)0x0;
  }
  else {
    peVar1 = (ir->then_instructions).head_sentinel.next;
    if (peVar1 == (exec_node *)0x0) {
      local_40 = (ir_instruction *)0x0;
    }
    else {
      local_40 = (ir_instruction *)&peVar1[-1].prev;
    }
    local_48 = local_40;
  }
  inst_1 = local_48;
  while (inst_1 != (ir_instruction *)0x0) {
    indent(this);
    (*inst_1->_vptr_ir_instruction[2])(inst_1,this);
    end_statement_line(this);
    bVar2 = ::exec_node_is_tail_sentinel((inst_1->super_exec_node).next);
    if (bVar2) {
      local_60 = (ir_instruction *)0x0;
    }
    else {
      peVar1 = (inst_1->super_exec_node).next;
      if (peVar1 == (exec_node *)0x0) {
        local_58 = (ir_instruction *)0x0;
      }
      else {
        local_58 = (ir_instruction *)&peVar1[-1].prev;
      }
      local_60 = local_58;
    }
    inst_1 = local_60;
  }
  this->indentation = this->indentation + -1;
  indent(this);
  string_buffer::asprintf_append(this->buffer,"}");
  bVar2 = exec_list::is_empty(&ir->else_instructions);
  if (!bVar2) {
    string_buffer::asprintf_append(this->buffer," else {\n");
    this->indentation = this->indentation + 1;
    this->previous_skipped = false;
    bVar2 = ::exec_node_is_tail_sentinel((ir->else_instructions).head_sentinel.next);
    if (bVar2) {
      local_78 = (exec_node **)0x0;
    }
    else {
      peVar1 = (ir->else_instructions).head_sentinel.next;
      if (peVar1 == (exec_node *)0x0) {
        local_70 = (exec_node **)0x0;
      }
      else {
        local_70 = &peVar1[-1].prev;
      }
      local_78 = local_70;
    }
    local_28 = local_78;
    while (local_28 != (exec_node **)0x0) {
      indent(this);
      (*(code *)(*local_28)[1].next)(local_28,this);
      end_statement_line(this);
      bVar2 = ::exec_node_is_tail_sentinel(local_28[1]);
      if (bVar2) {
        local_90 = (exec_node **)0x0;
      }
      else {
        if (local_28[1] == (exec_node *)0x0) {
          local_88 = (exec_node **)0x0;
        }
        else {
          local_88 = (exec_node **)((long)local_28[1] + -8);
        }
        local_90 = local_88;
      }
      local_28 = local_90;
    }
    this->indentation = this->indentation + -1;
    indent(this);
    string_buffer::asprintf_append(this->buffer,"}");
  }
  return;
}

Assistant:

void
ir_print_glsl_visitor::visit(ir_if *ir)
{
   buffer.asprintf_append ("if (");
   ir->condition->accept(this);

   buffer.asprintf_append (") {\n");
	indentation++; previous_skipped = false;


   foreach_in_list(ir_instruction, inst, &ir->then_instructions) {
      indent();
      inst->accept(this);
	   end_statement_line();
   }

   indentation--;
   indent();
   buffer.asprintf_append ("}");

   if (!ir->else_instructions.is_empty())
   {
	   buffer.asprintf_append (" else {\n");
	   indentation++; previous_skipped = false;

	   foreach_in_list(ir_instruction, inst, &ir->else_instructions) {
		  indent();
		  inst->accept(this);
		   end_statement_line();
	   }
	   indentation--;
	   indent();
	   buffer.asprintf_append ("}");
   }
}